

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O0

int compareteams(void *arg1,void *arg2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *__s1;
  char *__s2;
  int local_2c;
  int diff;
  player_t *p2;
  player_t *p1;
  void *arg2_local;
  void *arg1_local;
  
  lVar1 = *arg1;
  lVar2 = *arg2;
  local_2c = userinfo_t::GetTeam((userinfo_t *)(lVar1 + 0x38));
  iVar3 = userinfo_t::GetTeam((userinfo_t *)(lVar2 + 0x38));
  local_2c = local_2c - iVar3;
  if ((local_2c == 0) && (local_2c = *(int *)(lVar2 + 0xc4) - *(int *)(lVar1 + 0xc4), local_2c == 0)
     ) {
    __s1 = userinfo_t::GetName((userinfo_t *)(lVar1 + 0x38));
    __s2 = userinfo_t::GetName((userinfo_t *)(lVar2 + 0x38));
    local_2c = strcasecmp(__s1,__s2);
  }
  return local_2c;
}

Assistant:

int compareteams (const void *arg1, const void *arg2)
{
	// Compare first by teams, then by frags, then by name.
	player_t *p1 = *(player_t **)arg1;
	player_t *p2 = *(player_t **)arg2;
	int diff;

	diff = p1->userinfo.GetTeam() - p2->userinfo.GetTeam();
	if (diff == 0)
	{
		diff = p2->fragcount - p1->fragcount;
		if (diff == 0)
		{
			diff = stricmp (p1->userinfo.GetName(), p2->userinfo.GetName());
		}
	}
	return diff;
}